

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O2

void __thiscall
HighsCliqueTable::extractCliques
          (HighsCliqueTable *this,HighsMipSolver *mipsolver,vector<int,_std::allocator<int>_> *inds,
          vector<double,_std::allocator<double>_> *vals,
          vector<signed_char,_std::allocator<signed_char>_> *complementation,double rhs,
          HighsInt nbin,vector<int,_std::allocator<int>_> *perm,
          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *clique,
          double feastol)

{
  double dVar1;
  HighsInt HVar2;
  int iVar3;
  HighsMipSolverData *pHVar4;
  pointer piVar5;
  long lVar6;
  double *pdVar7;
  pointer pCVar8;
  pointer pdVar9;
  CliqueVar *cliquevars;
  bool bVar10;
  int iVar11;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end;
  HighsCDouble *v;
  uint numcliquevars;
  HighsInt *pHVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  HighsInt j;
  long lVar18;
  long lVar19;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  HighsInt *pHVar20;
  int *piVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  HighsCDouble HVar25;
  HighsCDouble impliedub;
  HighsCDouble local_d0;
  double local_c0;
  HighsCDouble local_b8;
  long local_a0;
  HighsMipSolver *local_98;
  HighsCliqueTable *local_90;
  HighsImplications *local_88;
  HighsCDouble colub;
  
  pHVar4 = (mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  local_88 = &pHVar4->implications;
  local_c0 = rhs;
  local_90 = this;
  std::vector<int,_std::allocator<int>_>::resize
            (perm,(long)(inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 2);
  pHVar20 = (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish;
  iVar11 = 0;
  end._M_current =
       (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  for (pHVar12 = end._M_current; pHVar12 != pHVar20; pHVar12 = pHVar12 + 1) {
    *pHVar12 = iVar11;
    iVar11 = iVar11 + 1;
  }
  impliedub.hi = (double)&pHVar4->domain;
  impliedub.lo = (double)inds;
  local_98 = mipsolver;
  do {
    local_a0 = -(long)end._M_current;
    lVar19 = (long)end._M_current * -0x40000000;
    while( true ) {
      if (end._M_current == pHVar20) goto LAB_00276dd2;
      bVar10 = extractCliques::anon_class_16_2_0183c0cc::operator()
                         ((anon_class_16_2_0183c0cc *)&impliedub,*end._M_current);
      if (!bVar10) break;
      end._M_current = end._M_current + 1;
      local_a0 = local_a0 + -4;
      lVar19 = lVar19 + -0x100000000;
    }
    do {
      pHVar20 = pHVar20 + -1;
      if (pHVar20 == end._M_current) {
LAB_00276dd2:
        piVar5 = (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar13 = (ulong)-(local_a0 + (long)piVar5) >> 2;
        numcliquevars = (uint)uVar13;
        iVar11 = (int)((ulong)((long)(perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data._M_finish - (long)piVar5) >> 2);
        if ((int)numcliquevars < iVar11) {
          for (uVar14 = 0; uVar14 != (uVar13 & 0xffffffff); uVar14 = uVar14 + 1) {
            iVar3 = (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar14];
            HVar2 = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[iVar3];
            colub.hi = local_c0;
            colub.lo = 0.0;
            HVar25 = HighsCDouble::operator-
                               (&colub,(vals->super__Vector_base<double,_std::allocator<double>_>).
                                       _M_impl.super__Vector_impl_data._M_start[iVar3]);
            impliedub.lo = HVar25.lo;
            impliedub.hi = HVar25.hi;
            for (lVar18 = -((long)piVar5 * 0x40000000 + lVar19) >> 0x20; iVar11 != lVar18;
                lVar18 = lVar18 + 1) {
              iVar3 = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start
                      [(perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar18]];
              lVar17 = (long)iVar3;
              lVar6 = *(long *)&(pHVar4->domain).col_lower_.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl;
              dVar24 = *(double *)(lVar6 + lVar17 * 8);
              dVar22 = *(double *)
                        (*(long *)&(pHVar4->domain).col_upper_.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl +
                        lVar17 * 8);
              if ((dVar24 != dVar22) || (NAN(dVar24) || NAN(dVar22))) {
                local_d0.lo = 0.0;
                local_d0.hi = dVar22;
                HVar25 = HighsCDouble::operator-(&local_d0,*(double *)(lVar6 + lVar17 * 8));
                colub.lo = HVar25.lo;
                colub.hi = HVar25.hi;
                HVar25 = HighsCDouble::operator/
                                   (&impliedub,
                                    (vals->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_start
                                    [(perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data._M_start[lVar18]]);
                local_d0.lo = HVar25.lo;
                local_d0.hi = HVar25.hi;
                if ((local_98->model_->integrality_).
                    super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar17] != kContinuous) {
                  local_d0.hi = floor(local_d0.hi + local_d0.lo +
                                      ((local_98->mipdata_)._M_t.
                                       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                       .super__Head_base<0UL,_HighsMipSolverData_*,_false>.
                                      _M_head_impl)->feastol);
                  local_d0.lo = 0.0;
                }
                HVar25 = HighsCDouble::operator-(&colub,feastol);
                if (local_d0.hi + local_d0.lo < HVar25.lo + HVar25.hi) {
                  if ((complementation->
                      super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                      super__Vector_impl_data._M_start
                      [(perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar14]] == -1) {
                    v = &local_d0;
                    HVar25 = HighsCDouble::operator-(&colub,v);
                    dVar22 = HVar25.lo;
                    dVar24 = HVar25.hi;
                  }
                  else {
                    HVar25 = HighsCDouble::operator-(&local_d0,&colub);
                    dVar22 = HVar25.lo;
                    dVar24 = HVar25.hi;
                    v = &colub;
                  }
                  local_b8.hi = v->hi;
                  local_b8.lo = v->lo;
                  if ((complementation->
                      super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                      super__Vector_impl_data._M_start
                      [(perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar18]] == -1) {
                    HighsCDouble::operator-=
                              (&local_b8,
                               *(double *)
                                (*(long *)&(pHVar4->domain).col_upper_.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl + lVar17 * 8));
                    HighsImplications::addVLB
                              (local_88,iVar3,HVar2,-(dVar24 + dVar22),-(local_b8.hi + local_b8.lo))
                    ;
                  }
                  else {
                    dVar1 = *(double *)
                             (*(long *)&(pHVar4->domain).col_lower_.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl
                             + lVar17 * 8);
                    dVar23 = dVar1 + local_b8.hi;
                    local_b8.lo = (local_b8.hi - (dVar23 - dVar1)) +
                                  (dVar1 - (dVar23 - (dVar23 - dVar1))) + local_b8.lo;
                    local_b8.hi = dVar23;
                    HighsImplications::addVUB
                              (local_88,iVar3,HVar2,dVar24 + dVar22,local_b8.lo + dVar23);
                  }
                }
              }
            }
          }
        }
        if (1 < (int)numcliquevars) {
          begin._M_current =
               (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start;
          if (end._M_current != begin._M_current) {
            iVar11 = pdqsort_detail::log2<long>(-(local_a0 + (long)begin._M_current) >> 2);
            pdqsort_detail::
            pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliques(HighsMipSolver_const&,std::vector<int,std::allocator<int>>&,std::vector<double,std::allocator<double>>&,std::vector<signed_char,std::allocator<signed_char>>&,double,int,std::vector<int,std::allocator<int>>&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,double)::__1,false>
                      (begin,end,(anon_class_8_1_8992ca70)vals,iVar11,true);
            begin._M_current =
                 (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
          }
          pdVar7 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if (local_c0 + feastol < pdVar7[*begin._M_current] + pdVar7[begin._M_current[1]]) {
            dVar24 = pdVar7[begin._M_current[numcliquevars - 1]];
            if ((feastol < ABS(*pdVar7 - dVar24)) || ((dVar24 + dVar24) - feastol <= local_c0)) {
              uVar13 = (ulong)(numcliquevars - 1);
              do {
                while( true ) {
                  do {
                    uVar14 = uVar13;
                    uVar13 = uVar14 - 1;
                    if (uVar14 == 0) {
                      return;
                    }
                    pdVar9 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start;
                    uVar15 = uVar14;
                    piVar21 = begin._M_current;
                    while (uVar16 = uVar15, 0 < (long)uVar16) {
                      uVar15 = uVar16 >> 1;
                      if ((local_c0 - pdVar9[begin._M_current[uVar14]]) + feastol <
                          pdVar9[piVar21[uVar15]]) {
                        piVar21 = piVar21 + uVar15 + 1;
                        uVar15 = ~uVar15 + uVar16;
                      }
                    }
                  } while (piVar21 == begin._M_current);
                  pCVar8 = (clique->
                           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  if ((clique->
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      )._M_impl.super__Vector_impl_data._M_finish != pCVar8) {
                    (clique->
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    )._M_impl.super__Vector_impl_data._M_finish = pCVar8;
                    begin._M_current =
                         (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                  }
                  for (; begin._M_current != piVar21; begin._M_current = begin._M_current + 1) {
                    if ((complementation->
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                        super__Vector_impl_data._M_start[*begin._M_current] == -1) {
                      impliedub.hi = (double)((ulong)impliedub.hi._4_4_ << 0x20);
                    }
                    else {
                      impliedub.hi = (double)CONCAT44(impliedub.hi._4_4_,1);
                    }
                    std::
                    vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                    ::emplace_back<int&,int>
                              ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                                *)clique,
                               (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + *begin._M_current,
                               (int *)&impliedub);
                  }
                  iVar11 = (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start[uVar14];
                  if ((complementation->
                      super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                      super__Vector_impl_data._M_start[iVar11] == -1) {
                    impliedub.hi = (double)((ulong)impliedub.hi._4_4_ << 0x20);
                  }
                  else {
                    impliedub.hi = (double)CONCAT44(impliedub.hi._4_4_,1);
                  }
                  std::
                  vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
                  emplace_back<int&,int>
                            ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                              *)clique,
                             (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + iVar11,(int *)&impliedub);
                  cliquevars = (clique->
                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               )._M_impl.super__Vector_impl_data._M_start;
                  uVar15 = (long)(clique->
                                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)cliquevars >> 2
                  ;
                  if (uVar15 < 2) break;
                  addClique(local_90,local_98,cliquevars,(HighsInt)uVar15,false,0x7fffffff);
                  if ((pHVar4->domain).infeasible_ != false) {
                    return;
                  }
                  begin._M_current =
                       (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
                  if (piVar21 == begin._M_current + uVar14) {
                    return;
                  }
                }
                begin._M_current =
                     (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
              } while (piVar21 != begin._M_current + uVar14);
            }
            else {
              pCVar8 = (clique->
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if ((clique->
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  )._M_impl.super__Vector_impl_data._M_finish != pCVar8) {
                (clique->
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                )._M_impl.super__Vector_impl_data._M_finish = pCVar8;
              }
              for (uVar13 = 0; (numcliquevars & 0x7fffffff) != uVar13; uVar13 = uVar13 + 1) {
                iVar11 = (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar13];
                if ((complementation->super__Vector_base<signed_char,_std::allocator<signed_char>_>)
                    ._M_impl.super__Vector_impl_data._M_start[iVar11] == -1) {
                  impliedub.hi = (double)((ulong)impliedub.hi._4_4_ << 0x20);
                }
                else {
                  impliedub.hi = (double)CONCAT44(impliedub.hi._4_4_,1);
                }
                std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                ::emplace_back<int&,int>
                          ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                            *)clique,
                           (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + iVar11,(int *)&impliedub);
              }
              addClique(local_90,local_98,
                        (clique->
                        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        )._M_impl.super__Vector_impl_data._M_start,numcliquevars,false,0x7fffffff);
            }
          }
        }
        return;
      }
      bVar10 = extractCliques::anon_class_16_2_0183c0cc::operator()
                         ((anon_class_16_2_0183c0cc *)&impliedub,*pHVar20);
    } while (!bVar10);
    HVar2 = *end._M_current;
    *end._M_current = *pHVar20;
    *pHVar20 = HVar2;
    end._M_current = end._M_current + 1;
  } while( true );
}

Assistant:

void HighsCliqueTable::extractCliques(
    const HighsMipSolver& mipsolver, std::vector<HighsInt>& inds,
    std::vector<double>& vals, std::vector<int8_t>& complementation, double rhs,
    HighsInt nbin, std::vector<HighsInt>& perm, std::vector<CliqueVar>& clique,
    double feastol) {
  HighsImplications& implics = mipsolver.mipdata_->implications;
  HighsDomain& globaldom = mipsolver.mipdata_->domain;

  perm.resize(inds.size());
  std::iota(perm.begin(), perm.end(), 0);

  auto binaryend = std::partition(perm.begin(), perm.end(), [&](HighsInt pos) {
    return globaldom.isBinary(inds[pos]);
  });
  nbin = binaryend - perm.begin();
  HighsInt ntotal = (HighsInt)perm.size();

  // if not all variables are binary, we extract variable upper and lower bounds
  // constraints on the non-binary variable for each binary variable in the
  // constraint
  if (nbin < ntotal) {
    for (HighsInt i = 0; i != nbin; ++i) {
      HighsInt bincol = inds[perm[i]];
      HighsCDouble impliedub = HighsCDouble(rhs) - vals[perm[i]];
      for (HighsInt j = nbin; j != ntotal; ++j) {
        HighsInt col = inds[perm[j]];
        if (globaldom.isFixed(col)) continue;

        HighsCDouble colub =
            HighsCDouble(globaldom.col_upper_[col]) - globaldom.col_lower_[col];
        HighsCDouble implcolub = impliedub / vals[perm[j]];
        if (mipsolver.variableType(col) != HighsVarType::kContinuous)
          implcolub =
              std::floor(double(implcolub) + mipsolver.mipdata_->feastol);

        if (implcolub < colub - feastol) {
          HighsCDouble coef;
          HighsCDouble constant;

          if (complementation[perm[i]] == -1) {
            coef = colub - implcolub;
            constant = implcolub;
          } else {
            coef = implcolub - colub;
            constant = colub;
          }

          if (complementation[perm[j]] == -1) {
            constant -= globaldom.col_upper_[col];
            implics.addVLB(col, bincol, -double(coef), -double(constant));
          } else {
            constant += globaldom.col_lower_[col];
            implics.addVUB(col, bincol, double(coef), double(constant));
          }
        }
      }
    }
  }

  // only one binary means we do have no cliques
  if (nbin <= 1) return;

  pdqsort(perm.begin(), binaryend, [&](HighsInt p1, HighsInt p2) {
    return std::make_pair(vals[p1], p1) > std::make_pair(vals[p2], p2);
  });
  // check if any cliques exists
  if (vals[perm[0]] + vals[perm[1]] <= rhs + feastol) return;

  // check if this is a set packing constraint (or easily transformable
  // into one)
  if (std::abs(vals[0] - vals[perm[nbin - 1]]) <= feastol &&
      rhs < 2 * vals[perm[nbin - 1]] - feastol) {
    // the coefficients on the binary variables are all equal and the
    // right hand side is strictly below two times the coefficient value.
    // Therefore the constraint can be transformed into a set packing
    // constraint by relaxing out all non-binary variables (if any),
    // dividing by the coefficient value of the binary variables, and then
    // possibly rounding down the right hand side
    clique.clear();

    for (auto j = 0; j != nbin; ++j) {
      HighsInt pos = perm[j];
      if (complementation[pos] == -1)
        clique.emplace_back(inds[pos], 0);
      else
        clique.emplace_back(inds[pos], 1);
    }

    addClique(mipsolver, clique.data(), nbin);
    if (globaldom.infeasible()) return;
    // printf("extracted this clique:\n");
    // printClique(clique);
    return;
  }

  for (HighsInt k = nbin - 1; k != 0; --k) {
    double mincliqueval = rhs - vals[perm[k]] + feastol;
    auto cliqueend = std::partition_point(
        perm.begin(), perm.begin() + k,
        [&](HighsInt p) { return vals[p] > mincliqueval; });

    // no clique for this variable
    if (cliqueend == perm.begin()) continue;

    clique.clear();

    for (auto j = perm.begin(); j != cliqueend; ++j) {
      HighsInt pos = *j;
      if (complementation[pos] == -1)
        clique.emplace_back(inds[pos], 0);
      else
        clique.emplace_back(inds[pos], 1);
    }

    if (complementation[perm[k]] == -1)
      clique.emplace_back(inds[perm[k]], 0);
    else
      clique.emplace_back(inds[perm[k]], 1);

    // printf("extracted this clique:\n");
    // printClique(clique);

    if (clique.size() >= 2) {
      // if (clique.size() > 2) runCliqueSubsumption(globaldom, clique);
      // runCliqueMerging(globaldom, clique);
      // if (clique.size() >= 2) {
      addClique(mipsolver, clique.data(), clique.size());
      if (globaldom.infeasible()) return;
      //}
    }

    // further cliques are just subsets of this clique
    if (cliqueend == perm.begin() + k) return;
  }
}